

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void gen_load_exclusive(DisasContext_conflict1 *s,int rt,int rt2,TCGv_i64 addr,int size,
                       _Bool is_pair)

{
  MemOp MVar1;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGTemp *ts;
  uint ofs;
  uintptr_t o_3;
  ulong idx;
  
  if (3 < size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x94c,"size <= 3");
  }
  tcg_ctx = s->uc->tcg_ctx;
  MVar1 = s->be_data;
  idx = (ulong)(s->mmu_idx & 0xf);
  if (is_pair) {
    if (size < 2) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x94e,"size >= 2");
    }
    if (size == 2) {
      tcg_gen_qemu_ld_i64_aarch64
                (tcg_ctx,tcg_ctx->cpu_exclusive_val,addr,idx,MVar1 | (MO_ALIGN|MO_64));
      MVar1 = s->be_data;
      pTVar2 = cpu_reg_aarch64(s,rt);
      if (MVar1 == MO_8) {
        tcg_gen_extract_i64_aarch64(tcg_ctx,pTVar2,tcg_ctx->cpu_exclusive_val,0,0x20);
        pTVar3 = cpu_reg_aarch64(s,rt2);
        pTVar2 = tcg_ctx->cpu_exclusive_val;
        ofs = 0x20;
      }
      else {
        tcg_gen_extract_i64_aarch64(tcg_ctx,pTVar2,tcg_ctx->cpu_exclusive_val,0x20,0x20);
        pTVar3 = cpu_reg_aarch64(s,rt2);
        pTVar2 = tcg_ctx->cpu_exclusive_val;
        ofs = 0;
      }
      tcg_gen_extract_i64_aarch64(tcg_ctx,pTVar3,pTVar2,ofs,0x20);
      goto LAB_006a4068;
    }
    tcg_gen_qemu_ld_i64_aarch64
              (tcg_ctx,tcg_ctx->cpu_exclusive_val,addr,idx,MVar1 | (MO_ALIGN_16|MO_64));
    ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_aarch64(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),addr,8);
    tcg_gen_qemu_ld_i64_aarch64
              (tcg_ctx,tcg_ctx->cpu_exclusive_high,(TCGv_i64)((long)ts - (long)tcg_ctx),idx,
               MVar1 | MO_64);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    pTVar2 = cpu_reg_aarch64(s,rt);
    if (pTVar2 != tcg_ctx->cpu_exclusive_val) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_exclusive_val + (long)tcg_ctx));
    }
    pTVar3 = cpu_reg_aarch64(s,rt2);
    pTVar2 = tcg_ctx->cpu_exclusive_high;
  }
  else {
    tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,tcg_ctx->cpu_exclusive_val,addr,idx,MVar1 | size | MO_ALIGN)
    ;
    pTVar3 = cpu_reg_aarch64(s,rt);
    pTVar2 = tcg_ctx->cpu_exclusive_val;
  }
  if (pTVar3 != pTVar2) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar3 + (long)tcg_ctx),
                        (TCGArg)(pTVar2 + (long)tcg_ctx));
  }
LAB_006a4068:
  if (tcg_ctx->cpu_exclusive_addr != addr) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,
                        (TCGArg)(tcg_ctx->cpu_exclusive_addr + (long)tcg_ctx),
                        (TCGArg)(addr + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void gen_load_exclusive(DisasContext *s, int rt, int rt2,
                               TCGv_i64 addr, int size, bool is_pair)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int idx = get_mem_index(s);
    MemOp memop = s->be_data;

    g_assert(size <= 3);
    if (is_pair) {
        g_assert(size >= 2);
        if (size == 2) {
            /* The pair must be single-copy atomic for the doubleword.  */
            memop |= MO_64 | MO_ALIGN;
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_val, addr, idx, memop);
            if (s->be_data == MO_LE) {
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val, 0, 32);
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt2), tcg_ctx->cpu_exclusive_val, 32, 32);
            } else {
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val, 32, 32);
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt2), tcg_ctx->cpu_exclusive_val, 0, 32);
            }
        } else {
            /* The pair must be single-copy atomic for *each* doubleword, not
               the entire quadword, however it must be quadword aligned.  */
            memop |= MO_64;
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_val, addr, idx,
                                memop | MO_ALIGN_16);

            TCGv_i64 addr2 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_addi_i64(tcg_ctx, addr2, addr, 8);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_high, addr2, idx, memop);
            tcg_temp_free_i64(tcg_ctx, addr2);

            tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val);
            tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rt2), tcg_ctx->cpu_exclusive_high);
        }
    } else {
        memop |= size | MO_ALIGN;
        tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_val, addr, idx, memop);
        tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val);
    }
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_exclusive_addr, addr);
}